

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<pollfd>::reallocateAndGrow
          (QArrayDataPointer<pollfd> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<pollfd> *old)

{
  long lVar1;
  bool bVar2;
  pollfd *ppVar3;
  QPodArrayOps<pollfd> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<pollfd> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<pollfd> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<pollfd> *in_stack_ffffffffffffff70;
  QArrayDataPointer<pollfd> *in_stack_ffffffffffffff78;
  QArrayDataPointer<pollfd> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<pollfd> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppVar3 = data((QArrayDataPointer<pollfd> *)&stack0xffffffffffffffe0),
       ppVar3 == (pollfd *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_006c1ff4;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<pollfd> *)
                  operator->((QArrayDataPointer<pollfd> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<pollfd> *)0x6c1f07);
        begin((QArrayDataPointer<pollfd> *)0x6c1f16);
        QtPrivate::QPodArrayOps<pollfd>::copyAppend
                  (this_00,(pollfd *)in_stack_ffffffffffffff78,(pollfd *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<pollfd> *)
             operator->((QArrayDataPointer<pollfd> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<pollfd> *)0x6c1f4f);
        begin((QArrayDataPointer<pollfd> *)0x6c1f5e);
        QtPrivate::QPodArrayOps<pollfd>::moveAppend
                  ((QPodArrayOps<pollfd> *)in_stack_ffffffffffffff70,
                   (pollfd *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (pollfd *)0x6c1f7c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<pollfd> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<pollfd> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<pollfd>::reallocate
              ((QPodArrayOps<pollfd> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_006c1ff4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }